

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.h
# Opt level: O1

void __thiscall draco::PlyElement::~PlyElement(PlyElement *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->property_index_)._M_t);
  std::vector<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>::~vector(&this->properties_);
  pcVar1 = (this->name_)._M_dataplus._M_p;
  paVar2 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

void AddProperty(const PlyProperty &prop) {
    property_index_[prop.name()] = static_cast<int>(properties_.size());
    properties_.emplace_back(prop);
    if (!properties_.back().is_list()) {
      properties_.back().ReserveData(static_cast<int>(num_entries_));
    }
  }